

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O3

int ixmlDocument_importNode
              (IXML_Document_conflict *doc,IXML_Node_conflict *importNode,int deep,
              IXML_Node_conflict **rtNode)

{
  unsigned_short uVar1;
  int iVar2;
  IXML_Node_conflict *nodeptr;
  
  *rtNode = (IXML_Node_conflict *)0x0;
  iVar2 = 0x69;
  if (importNode != (IXML_Node_conflict *)0x0 && doc != (IXML_Document_conflict *)0x0) {
    uVar1 = ixmlNode_getNodeType(importNode);
    iVar2 = 9;
    if (uVar1 != 9) {
      nodeptr = ixmlNode_cloneNode(importNode,deep);
      if (nodeptr == (IXML_Node_conflict *)0x0) {
        iVar2 = 0x6a;
      }
      else {
        ixmlDocument_setOwnerDocument(doc,nodeptr);
        *rtNode = nodeptr;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int ixmlDocument_importNode(
	IXML_Document *doc, IXML_Node *importNode, int deep, IXML_Node **rtNode)
{
	unsigned short nodeType;
	IXML_Node *newNode;

	*rtNode = NULL;

	if (doc == NULL || importNode == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	nodeType = ixmlNode_getNodeType(importNode);
	if (nodeType == eDOCUMENT_NODE) {
		return IXML_NOT_SUPPORTED_ERR;
	}

	newNode = ixmlNode_cloneNode(importNode, deep);
	if (newNode == NULL) {
		return IXML_FAILED;
	}

	ixmlDocument_setOwnerDocument(doc, newNode);
	*rtNode = newNode;

	return IXML_SUCCESS;
}